

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O2

void __thiscall
ConfidentialTransaction_SignatureHashTest_Test::ConfidentialTransaction_SignatureHashTest_Test
          (ConfidentialTransaction_SignatureHashTest_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_005c7be0;
  return;
}

Assistant:

TEST(ConfidentialTransaction, SignatureHashTest) {
  ConfidentialTransaction tx(
      "020000000001319bff5f4311e6255ecf4dd472650a6ef85fde7d11cd10d3e6ba5974174aeb560100000000ffffffff0201f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f0100000bd2cc1584c002deb65cc52301e1622f482a2f588b9800d2b8386ffabf74d6b2d73d17503a2f921976a9146a98a3f2935718df72518c00768ec67c589e0b2888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f0100000000004c4b40000000000000");
  // double inputamount = 130000.0;
  // Amount amount = Amount::CreateByCoinAmount(inputamount);
  ByteData256 byte_data;
  SigHashType sig_hash_type(SigHashAlgorithm::kSigHashAll);
  Pubkey utxo_pubkey(
      "020ff7000e2754f34aeb894f1e4dc985e3f9742b194fac2350f963dfa219f177c4");
  ScriptBuilder builder;
  builder.AppendOperator(ScriptOperator::OP_DUP);
  builder.AppendOperator(ScriptOperator::OP_HASH160);
  builder.AppendData(HashUtil::Hash160(utxo_pubkey));
  builder.AppendOperator(ScriptOperator::OP_EQUALVERIFY);
  builder.AppendOperator(ScriptOperator::OP_CHECKSIG);
  ByteData script_byte = builder.Build().GetData();

  EXPECT_NO_THROW(
      (byte_data = tx.GetElementsSignatureHash(0, script_byte, sig_hash_type)));
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "d0b8a3b596813756ca042fd510c4acac522378e8e3ac610fdc0301f6921aac34");

  Script empty_script;
  EXPECT_THROW(
      (byte_data = tx.GetElementsSignatureHash(
          0, empty_script.GetData(), sig_hash_type)), CfdException);
}